

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadSplat<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  byte local_9;
  
  RVar1 = Load<unsigned_char>(this,instr,&local_9,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    value.v._8_8_ = (ulong)local_9 * 0x101010101010101;
    value.v._0_8_ = value.v._8_8_;
    Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}